

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::FunctionBody
          (FunctionBody *this,ScriptContext *scriptContext,char16 *displayName,
          uint displayNameLength,uint displayShortNameOffset,uint nestedCount,
          Utf8SourceInfo *utf8SourceInfo,uint uFunctionNumber,uint uScriptId,
          LocalFunctionId functionId,Attributes attributes,FunctionBodyFlags flags)

{
  undefined1 *puVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Recycler *alloc;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *ptr;
  FunctionEntryPointInfo *entryPointInfo;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  ParseableFunctionInfo::ParseableFunctionInfo
            (&this->super_ParseableFunctionInfo,scriptContext->CurrentThunk,nestedCount,functionId,
             utf8SourceInfo,scriptContext,uFunctionNumber,displayName,displayNameLength,
             displayShortNameOffset,attributes,flags);
  (this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_013770c8;
  CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::CompactCounters
            (&this->counters,this);
  this->regAllocStoreCount = 0;
  this->regAllocLoadCount = 0;
  this->callCountStats = 0;
  (this->m_sourceInfo).m_auxStatementData.ptr = (AuxStatementData *)0x0;
  (this->m_sourceInfo).pSpanSequence = (Type)0x0;
  (this->m_sourceInfo).frameDisplayRegister = 0;
  (this->m_sourceInfo).objectRegister = 0;
  (this->m_sourceInfo).m_probeCount = 0;
  (this->m_sourceInfo).pScopeObjectChain.ptr = (ScopeObjectChain *)0x0;
  (this->m_sourceInfo).m_probeBackingBlock.ptr = (ByteBlock *)0x0;
  (this->byteCodeBlock).ptr = (ByteBlock *)0x0;
  (this->entryPoints).ptr =
       (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
        *)0x0;
  (this->m_constTable).ptr = (WriteBarrierPtr<void> *)0x0;
  (this->inlineCaches).ptr = (void **)0x0;
  *(undefined8 *)((long)&(this->inlineCaches).ptr + 4) = 0;
  *(undefined8 *)((long)&(this->polymorphicInlineCaches).inlineCaches.ptr + 4) = 0;
  (this->cacheIdToPropertyIdMap).ptr = (int *)0x0;
  (this->m_inlineCacheTypes).ptr = (uchar *)0x0;
  *(undefined8 *)((long)&(this->m_inlineCacheTypes).ptr + 5) = 0;
  this->m_uScriptId = uScriptId;
  this->m_iProfileSession = -1;
  this->m_envDepth = 0xffff;
  this->m_argUsedForBranch = 0;
  this->profiledLdLenCount = 0;
  this->profiledLdElemCount = 0;
  this->profiledStElemCount = 0;
  this->profiledCallSiteCount = 0;
  this->profiledArrayCallSiteCount = 0;
  this->profiledDivOrRemCount = 0;
  this->profiledSwitchCount = 0;
  this->profiledReturnTypeCount = 0;
  this->profiledSlotCount = 0;
  this->m_tag31 = true;
  this->m_hasFinally = false;
  this->hasScopeObject = false;
  this->hasCachedScopePropIds = false;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0x3820 | 0x4040001;
  *(ushort *)&this->field_0x17c = ((ushort)*(undefined4 *)&this->field_0x17c & 0xe400) + 1;
  this->bailOnMisingProfileCount = '\0';
  this->bailOnMisingProfileRejitCount = '\0';
  this->inlineDepth = '\0';
  FunctionExecutionStateMachine::FunctionExecutionStateMachine(&this->executionState);
  this->m_depth = 0;
  this->loopInterpreterLimit = DAT_0143ef08;
  this->m_asmJsTotalLoopCount = 0;
  this->debuggerScopeIndex = 0;
  this->savedPolymorphicCacheState = 0;
  this->byteCodeCache = (Type)0x0;
  (this->defaultFunctionEntryPointInfo).ptr = (FunctionEntryPointInfo *)0x0;
  (this->dynamicProfileInfo).ptr = (DynamicProfileInfo *)0x0;
  this->savedInlinerVersion = '\0';
  this->savedImplicitCallsFlags = ImplicitCall_HasNoInfo;
  SetCountField(this,ConstantCount,1);
  SetDefaultFunctionEntryPointInfo
            (this,(FunctionEntryPointInfo *)
                  (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.
                  ptr,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  puVar1 = &(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
  *puVar1 = *puVar1 | 2;
  if ((utf8SourceInfo != (Utf8SourceInfo *)0x0) &&
     (this->m_uScriptId !=
      ((((utf8SourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x280,
                                "(!utf8SourceInfo || m_uScriptId == utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId)"
                                ,
                                "!utf8SourceInfo || m_uScriptId == utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId"
                               );
    if (!bVar4) goto LAB_006c60ff;
    *puVar5 = 0;
  }
  pTVar2 = scriptContext->threadContext;
  local_58 = (undefined1  [8])
             &SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x284;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler,(TrackAllocData *)local_58);
  ptr = (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
         *)new<Memory::Recycler>(0x38,alloc,0x37a1d4);
  (ptr->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
  .alloc = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  (ptr->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
  .buffer.ptr = (WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_> *)0x0;
  (ptr->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
  .count = 0;
  (ptr->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).length = 0;
  (ptr->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).increment = 4;
  (ptr->
  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).
  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
  ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01377c88;
  ptr->syncObj = &pTVar2->csFunctionBody;
  Memory::
  WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
  ::WriteBarrierSet(&this->entryPoints,ptr);
  entryPointInfo = GetDefaultFunctionEntryPointInfo(this);
  AddEntryPointToEntryPointList(this,entryPointInfo);
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr)->
      jsMethod == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x288,"(this->GetDefaultEntryPointInfo()->jsMethod != nullptr)",
                                "this->GetDefaultEntryPointInfo()->jsMethod != nullptr");
    if (!bVar4) {
LAB_006c60ff:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  InitDisableInlineApply(this);
  InitDisableInlineSpread(this);
  return;
}

Assistant:

FunctionBody::FunctionBody(ScriptContext* scriptContext, const char16* displayName, uint displayNameLength, uint displayShortNameOffset, uint nestedCount,
        Utf8SourceInfo* utf8SourceInfo, uint uFunctionNumber, uint uScriptId,
        Js::LocalFunctionId  functionId, FunctionInfo::Attributes attributes, FunctionBodyFlags flags
#ifdef PERF_COUNTERS
        , bool isDeserializedFunction
#endif
        ) :
        ParseableFunctionInfo(scriptContext->CurrentThunk, nestedCount, functionId, utf8SourceInfo, scriptContext, uFunctionNumber, displayName, displayNameLength, displayShortNameOffset, attributes, flags),
        counters(this),
        m_uScriptId(uScriptId),
        cleanedUp(false),
        sourceInfoCleanedUp(false),
        profiledLdLenCount(0),
        profiledLdElemCount(0),
        profiledStElemCount(0),
        profiledCallSiteCount(0),
        profiledArrayCallSiteCount(0),
        profiledDivOrRemCount(0),
        profiledSwitchCount(0),
        profiledReturnTypeCount(0),
        profiledSlotCount(0),
        m_isFuncRegistered(false),
        m_isFuncRegisteredToDiag(false),
        m_hasBailoutInstrInJittedCode(false),
        m_depth(0),
        inlineDepth(0),
        m_pendingLoopHeaderRelease(false),
        hasCachedScopePropIds(false),
        m_argUsedForBranch(0),
        m_envDepth((uint16)-1),
        loopInterpreterLimit(CONFIG_FLAG(LoopInterpretCount)),
        savedPolymorphicCacheState(0),
        debuggerScopeIndex(0),
        m_hasFinally(false),
#if ENABLE_PROFILE_INFO
        dynamicProfileInfo(nullptr),
#endif
        savedInlinerVersion(0),
#if ENABLE_NATIVE_CODEGEN
        savedImplicitCallsFlags(ImplicitCall_HasNoInfo),
#endif
        hasExecutionDynamicProfileInfo(false),
        m_hasAllNonLocalReferenced(false),
        m_hasSetIsObject(false),
        m_hasFunExprNameReference(false),
        m_CallsEval(false),
        m_ChildCallsEval(false),
        m_hasReferenceableBuiltInArguments(false),
        m_isParamAndBodyScopeMerged(true),
        m_firstFunctionObject(true),
        m_inlineCachesOnFunctionObject(false),
        m_hasDoneAllNonLocalReferenced(false),
        m_hasFunctionCompiledSent(false),
        byteCodeCache(nullptr),
        m_hasLocalClosureRegister(false),
        m_hasParamClosureRegister(false),
        m_hasLocalFrameDisplayRegister(false),
        m_hasEnvRegister(false),
        m_hasThisRegisterForEventHandler(false),
        m_hasFirstInnerScopeRegister(false),
        m_hasFuncExprScopeRegister(false),
        m_hasFirstTmpRegister(false),
        m_hasActiveReference(false),
        m_tag31(true),
        m_tag32(true),
        m_tag33(true),
        m_nativeEntryPointUsed(false),
        hasDoneLoopBodyCodeGen(false),
        bailOnMisingProfileCount(0),
        bailOnMisingProfileRejitCount(0),
        byteCodeBlock(nullptr),
        entryPoints(nullptr),
        m_constTable(nullptr),
        inlineCaches(nullptr),
        cacheIdToPropertyIdMap(nullptr),
        wasCalledFromLoop(false),
        hasScopeObject(false),
        hasNestedLoop(false),
        recentlyBailedOutOfJittedLoopBody(false),
        m_isAsmJsScheduledForFullJIT(false),
        m_asmJsTotalLoopCount(0)
        //
        // Even if the function does not require any locals, we must always have "R0" to propagate
        // a return value.  By enabling this here, we avoid unnecessary conditionals during execution.
        //
#ifdef IR_VIEWER
        ,m_isIRDumpEnabled(false)
        ,m_irDumpBaseObject(nullptr)
#endif /* IR_VIEWER */
        , m_isFromNativeCodeModule(false)
        , hasHotLoop(false)
        , m_isPartialDeserializedFunction(false)
#if DBG
        , m_isSerialized(false)
#endif
#ifdef PERF_COUNTERS
        , m_isDeserializedFunction(isDeserializedFunction)
#endif
#if DBG
        , m_DEBUG_executionCount(0)
        , m_nativeEntryPointIsInterpreterThunk(false)
        , m_canDoStackNestedFunc(false)
        , m_inlineCacheTypes(nullptr)
        , m_iProfileSession(-1)
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
        , regAllocLoadCount(0)
        , regAllocStoreCount(0)
        , callCountStats(0)
#endif
    {
        SetCountField(CounterFields::ConstantCount, 1);

        this->SetDefaultFunctionEntryPointInfo((FunctionEntryPointInfo*) this->GetDefaultEntryPointInfo(), DefaultEntryThunk);
        this->m_hasBeenParsed = true;

#ifdef PERF_COUNTERS
        if (isDeserializedFunction)
        {
            PERF_COUNTER_INC(Code, DeserializedFunctionBody);
        }
#endif
        Assert(!utf8SourceInfo || m_uScriptId == utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId);

        // Sync entryPoints changes to etw rundown lock
        CriticalSection* syncObj = scriptContext->GetThreadContext()->GetFunctionBodyLock();
        this->entryPoints = RecyclerNew(this->m_scriptContext->GetRecycler(), FunctionEntryPointList, this->m_scriptContext->GetRecycler(), syncObj);

        this->AddEntryPointToEntryPointList(this->GetDefaultFunctionEntryPointInfo());

        Assert(this->GetDefaultEntryPointInfo()->jsMethod != nullptr);

        InitDisableInlineApply();
        InitDisableInlineSpread();
    }